

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr_test.c
# Opt level: O2

void itoa_test(zt_unit_test *test,void *data)

{
  int iVar1;
  ssize_t sVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uVar5;
  char buffer [100];
  
  buffer[0x50] = '\0';
  buffer[0x51] = '\0';
  buffer[0x52] = '\0';
  buffer[0x53] = '\0';
  buffer[0x54] = '\0';
  buffer[0x55] = '\0';
  buffer[0x56] = '\0';
  buffer[0x57] = '\0';
  buffer[0x58] = '\0';
  buffer[0x59] = '\0';
  buffer[0x5a] = '\0';
  buffer[0x5b] = '\0';
  buffer[0x5c] = '\0';
  buffer[0x5d] = '\0';
  buffer[0x5e] = '\0';
  buffer[0x5f] = '\0';
  buffer[0x40] = '\0';
  buffer[0x41] = '\0';
  buffer[0x42] = '\0';
  buffer[0x43] = '\0';
  buffer[0x44] = '\0';
  buffer[0x45] = '\0';
  buffer[0x46] = '\0';
  buffer[0x47] = '\0';
  buffer[0x48] = '\0';
  buffer[0x49] = '\0';
  buffer[0x4a] = '\0';
  buffer[0x4b] = '\0';
  buffer[0x4c] = '\0';
  buffer[0x4d] = '\0';
  buffer[0x4e] = '\0';
  buffer[0x4f] = '\0';
  buffer[0x30] = '\0';
  buffer[0x31] = '\0';
  buffer[0x32] = '\0';
  buffer[0x33] = '\0';
  buffer[0x34] = '\0';
  buffer[0x35] = '\0';
  buffer[0x36] = '\0';
  buffer[0x37] = '\0';
  buffer[0x38] = '\0';
  buffer[0x39] = '\0';
  buffer[0x3a] = '\0';
  buffer[0x3b] = '\0';
  buffer[0x3c] = '\0';
  buffer[0x3d] = '\0';
  buffer[0x3e] = '\0';
  buffer[0x3f] = '\0';
  buffer[0x20] = '\0';
  buffer[0x21] = '\0';
  buffer[0x22] = '\0';
  buffer[0x23] = '\0';
  buffer[0x24] = '\0';
  buffer[0x25] = '\0';
  buffer[0x26] = '\0';
  buffer[0x27] = '\0';
  buffer[0x28] = '\0';
  buffer[0x29] = '\0';
  buffer[0x2a] = '\0';
  buffer[0x2b] = '\0';
  buffer[0x2c] = '\0';
  buffer[0x2d] = '\0';
  buffer[0x2e] = '\0';
  buffer[0x2f] = '\0';
  buffer[0x10] = '\0';
  buffer[0x11] = '\0';
  buffer[0x12] = '\0';
  buffer[0x13] = '\0';
  buffer[0x14] = '\0';
  buffer[0x15] = '\0';
  buffer[0x16] = '\0';
  buffer[0x17] = '\0';
  buffer[0x18] = '\0';
  buffer[0x19] = '\0';
  buffer[0x1a] = '\0';
  buffer[0x1b] = '\0';
  buffer[0x1c] = '\0';
  buffer[0x1d] = '\0';
  buffer[0x1e] = '\0';
  buffer[0x1f] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0xd] = '\0';
  buffer[0xe] = '\0';
  buffer[0xf] = '\0';
  buffer[0x60] = '\0';
  buffer[0x61] = '\0';
  buffer[0x62] = '\0';
  buffer[99] = '\0';
  sVar2 = zt_cstr_itoa((char *)0x0,0,0,100);
  if (sVar2 == -1) {
    zt_unit_test_add_assertion(test);
    sVar2 = zt_cstr_itoa(buffer,0,0,0);
    if (sVar2 == -1) {
      zt_unit_test_add_assertion(test);
      sVar2 = zt_cstr_itoa(buffer,10,5,6);
      if (sVar2 == -1) {
        zt_unit_test_add_assertion(test);
        sVar2 = zt_cstr_itoa(buffer,0,0,100);
        if (sVar2 == 1) {
          zt_unit_test_add_assertion(test);
          if (buffer._0_2_ == 0x30) {
            zt_unit_test_add_assertion(test);
            sVar2 = zt_cstr_itoa(buffer,3,0,100);
            if (sVar2 == 1) {
              zt_unit_test_add_assertion(test);
              if (buffer._0_2_ == 0x33) {
                zt_unit_test_add_assertion(test);
                sVar2 = zt_cstr_itoa(buffer,10,0,100);
                if (sVar2 == 2) {
                  zt_unit_test_add_assertion(test);
                  iVar1 = bcmp("10",buffer,3);
                  if (iVar1 == 0) {
                    zt_unit_test_add_assertion(test);
                    sVar2 = zt_cstr_itoa(buffer,0x2a,0,100);
                    if (sVar2 == 2) {
                      zt_unit_test_add_assertion(test);
                      iVar1 = bcmp("42",buffer,3);
                      if (iVar1 == 0) {
                        zt_unit_test_add_assertion(test);
                        sVar2 = zt_cstr_itoa(buffer,0x3ade68b1,0,100);
                        if (sVar2 == 9) {
                          zt_unit_test_add_assertion(test);
                          iVar1 = bcmp("987654321",buffer,10);
                          if (iVar1 == 0) {
                            zt_unit_test_add_assertion(test);
                            sVar2 = zt_cstr_itoa(buffer,-3,0,100);
                            if (sVar2 == 2) {
                              zt_unit_test_add_assertion(test);
                              iVar1 = bcmp("-3",buffer,3);
                              if (iVar1 == 0) {
                                zt_unit_test_add_assertion(test);
                                sVar2 = zt_cstr_itoa(buffer,-10,0,100);
                                if (sVar2 == 3) {
                                  zt_unit_test_add_assertion(test);
                                  if (buffer._0_4_ == 0x30312d) {
                                    zt_unit_test_add_assertion(test);
                                    sVar2 = zt_cstr_itoa(buffer,-0x2a,0,100);
                                    if (sVar2 == 3) {
                                      zt_unit_test_add_assertion(test);
                                      if (buffer._0_4_ == 0x32342d) {
                                        zt_unit_test_add_assertion(test);
                                        sVar2 = zt_cstr_itoa(buffer,-0x3ade68b1,0,100);
                                        if (sVar2 == 10) {
                                          zt_unit_test_add_assertion(test);
                                          iVar1 = bcmp("-987654321",buffer,0xb);
                                          if (iVar1 == 0) {
                                            zt_unit_test_add_assertion(test);
                                            for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
                                              buffer[lVar3] = 'a';
                                            }
                                            sVar2 = zt_cstr_itoa(buffer,0x12d,3,100);
                                            if (sVar2 == 6) {
                                              zt_unit_test_add_assertion(test);
                                              iVar1 = bcmp("aaa301",buffer,7);
                                              if (iVar1 == 0) {
                                                zt_unit_test_add_assertion(test);
                                                for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
                                                  buffer[lVar3] = 'a';
                                                }
                                                sVar2 = zt_cstr_itoa(buffer,-0x1720,4,100);
                                                if (sVar2 == 9) {
                                                  zt_unit_test_add_assertion(test);
                                                  iVar1 = bcmp("aaaa-5920",buffer,10);
                                                  if (iVar1 == 0) {
                                                    zt_unit_test_add_assertion(test);
                                                    return;
                                                  }
                                                  pcVar4 = "strcmp(\"aaaa-5920\", buffer) == 0";
                                                  uVar5 = 0x18b;
                                                }
                                                else {
                                                  pcVar4 = 
                                                  "zt_cstr_itoa(buffer, -5920, 4, 100) == 9";
                                                  uVar5 = 0x18a;
                                                }
                                              }
                                              else {
                                                pcVar4 = "strcmp(\"aaa301\", buffer) == 0";
                                                uVar5 = 0x184;
                                              }
                                            }
                                            else {
                                              pcVar4 = "zt_cstr_itoa(buffer, 301, 3, 100) == 6";
                                              uVar5 = 0x183;
                                            }
                                          }
                                          else {
                                            pcVar4 = "strcmp(\"-987654321\", buffer) == 0";
                                            uVar5 = 0x17c;
                                          }
                                        }
                                        else {
                                          pcVar4 = "zt_cstr_itoa(buffer, -987654321, 0, 100) == 10";
                                          uVar5 = 0x17b;
                                        }
                                      }
                                      else {
                                        pcVar4 = "strcmp(\"-42\", buffer) == 0";
                                        uVar5 = 0x179;
                                      }
                                    }
                                    else {
                                      pcVar4 = "zt_cstr_itoa(buffer, -42, 0, 100) == 3";
                                      uVar5 = 0x178;
                                    }
                                  }
                                  else {
                                    pcVar4 = "strcmp(\"-10\", buffer) == 0";
                                    uVar5 = 0x176;
                                  }
                                }
                                else {
                                  pcVar4 = "zt_cstr_itoa(buffer, -10, 0, 100) == 3";
                                  uVar5 = 0x175;
                                }
                              }
                              else {
                                pcVar4 = "strcmp(\"-3\", buffer) == 0";
                                uVar5 = 0x173;
                              }
                            }
                            else {
                              pcVar4 = "zt_cstr_itoa(buffer, -3, 0, 100) == 2";
                              uVar5 = 0x172;
                            }
                          }
                          else {
                            pcVar4 = "strcmp(\"987654321\", buffer) == 0";
                            uVar5 = 0x170;
                          }
                        }
                        else {
                          pcVar4 = "zt_cstr_itoa(buffer, 987654321, 0, 100) == 9";
                          uVar5 = 0x16f;
                        }
                      }
                      else {
                        pcVar4 = "strcmp(\"42\", buffer) == 0";
                        uVar5 = 0x16d;
                      }
                    }
                    else {
                      pcVar4 = "zt_cstr_itoa(buffer, 42, 0, 100) == 2";
                      uVar5 = 0x16c;
                    }
                  }
                  else {
                    pcVar4 = "strcmp(\"10\", buffer) == 0";
                    uVar5 = 0x16a;
                  }
                }
                else {
                  pcVar4 = "zt_cstr_itoa(buffer, 10, 0, 100) == 2";
                  uVar5 = 0x169;
                }
              }
              else {
                pcVar4 = "strcmp(\"3\", buffer) == 0";
                uVar5 = 0x167;
              }
            }
            else {
              pcVar4 = "zt_cstr_itoa(buffer, 3, 0, 100) == 1";
              uVar5 = 0x166;
            }
          }
          else {
            pcVar4 = "strcmp(\"0\", buffer) == 0";
            uVar5 = 0x164;
          }
        }
        else {
          pcVar4 = "zt_cstr_itoa(buffer, 0, 0, 100) == 1";
          uVar5 = 0x163;
        }
      }
      else {
        pcVar4 = "zt_cstr_itoa(buffer, 10, 5, 6) == -1";
        uVar5 = 0x160;
      }
    }
    else {
      pcVar4 = "zt_cstr_itoa(buffer, 0, 0, 0) == -1";
      uVar5 = 0x15f;
    }
  }
  else {
    pcVar4 = "zt_cstr_itoa(NULL, 0, 0, 100) == -1";
    uVar5 = 0x15e;
  }
  iVar1 = zt_unit_printf(&test->error,"%s : %s:%d",pcVar4,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                         ,uVar5);
  if (iVar1 == 0) {
    test->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)test->env,1);
}

Assistant:

static void itoa_test(struct zt_unit_test *test, void *data UNUSED) {
  int i;
  char buffer[100];

  memset(buffer, 0, 100);

  /* Illegal input validation. */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(NULL, 0, 0, 100) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 0) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 5, 6) == -1);

  /* Valid inputs */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("0", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 3, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 42, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 987654321, 0, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("987654321", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -3, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("-3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -10, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -42, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -987654321, 0, 100) == 10);
  ZT_UNIT_ASSERT(test, strcmp("-987654321", buffer) == 0);

  /* offset */
  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 301, 3, 100) == 6);
  ZT_UNIT_ASSERT(test, strcmp("aaa301", buffer) == 0);

  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -5920, 4, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("aaaa-5920", buffer) == 0);
}